

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ConstantValue::convertToByteArray(ConstantValue *this,bitwidth_t size,bool isSigned)

{
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  size_type sVar4;
  byte in_CL;
  uint in_EDX;
  size_type in_RSI;
  ConstantValue *in_RDI;
  char ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  Elements array;
  string result;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  ConstantValue *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  byte local_15;
  uint local_14;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  bVar1 = isUnpacked((ConstantValue *)0x4ea558);
  if (bVar1) {
    ConstantValue((ConstantValue *)in_stack_fffffffffffffee0,
                  (ConstantValue *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    return in_RDI;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  uVar2 = isInteger((ConstantValue *)0x4ea589);
  if ((bool)uVar2) {
    convertToStr(in_stack_ffffffffffffff58);
    str_abi_cxx11_((ConstantValue *)in_stack_fffffffffffffee8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(in_stack_fffffffffffffee0);
    ~ConstantValue((ConstantValue *)0x4ea5f6);
  }
  else {
    in_stack_fffffffffffffef6 = isString((ConstantValue *)0x4ea644);
    if (!(bool)in_stack_fffffffffffffef6) {
      ConstantValue((ConstantValue *)in_stack_fffffffffffffee0,
                    (nullptr_t)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      goto LAB_004ea880;
    }
    in_stack_fffffffffffffee8 = str_abi_cxx11_((ConstantValue *)0x4ea65e);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffee0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  }
  if (local_14 == 0) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_38);
    local_14 = (uint)sVar3;
  }
  in_stack_fffffffffffffee0 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xffffffffffffff50
  ;
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0x4ea6ca);
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
            (in_stack_ffffffffffffff10,in_RSI);
  local_b8 = &local_38;
  local_c0._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(in_stack_fffffffffffffee8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (in_stack_fffffffffffffee8);
  while (bVar1 = __gnu_cxx::
                 operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffee0,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_c0);
    sVar4 = std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                      ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       &stack0xffffffffffffff50);
    if (local_14 <= sVar4) break;
    SVInt::SVInt((SVInt *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,
                                                  in_stack_fffffffffffffef0)),
                 (bitwidth_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (uint64_t)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
    std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
    emplace_back<slang::SVInt>
              ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
               (SVInt *)in_stack_fffffffffffffee8);
    SVInt::~SVInt((SVInt *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,
                                                   in_stack_fffffffffffffef0)));
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_c0);
  }
  while (sVar4 = std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                           ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                            &stack0xffffffffffffff50), sVar4 < local_14) {
    SVInt::SVInt((SVInt *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,
                                                  in_stack_fffffffffffffef0)),
                 (bitwidth_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (uint64_t)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
    std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
    emplace_back<slang::SVInt>
              ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
               (SVInt *)in_stack_fffffffffffffee8);
    SVInt::~SVInt((SVInt *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,
                                                   in_stack_fffffffffffffef0)));
  }
  ConstantValue((ConstantValue *)in_stack_fffffffffffffee0,
                (Elements *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
LAB_004ea880:
  std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  return in_RDI;
}

Assistant:

ConstantValue ConstantValue::convertToByteArray(bitwidth_t size, bool isSigned) const {
    if (isUnpacked())
        return *this;

    std::string result;
    if (isInteger())
        result = convertToStr().str();
    else if (isString())
        result = str();
    else
        return nullptr;

    if (!size) // dynamic array use string size
        size = static_cast<bitwidth_t>(result.size());

    Elements array;
    array.reserve(size);

    for (auto ch : result) {
        if (array.size() >= size)
            break;
        array.emplace_back(SVInt(8, static_cast<uint64_t>(ch), isSigned));
    }

    while (array.size() < size)
        array.emplace_back(SVInt(8, 0, isSigned));
    return array;
}